

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeShaderFunctionTests.cpp
# Opt level: O2

void deqp::gles31::Functional::NegativeTestShared::anon_unknown_0::texture_lod_invalid_p
               (NegativeTestContext *ctx)

{
  ShaderType shaderType;
  DataType DVar1;
  bool bVar2;
  ContextType ctxType;
  char *__s;
  DataType dataType;
  long lVar3;
  long lVar4;
  DataType in_stack_fffffffffffffe28;
  allocator<char> local_1c9;
  long local_1c8;
  string shaderSource;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  ctxType.super_ApiType.m_bits = (ApiType)(*ctx->m_renderCtx->_vptr_RenderContext[2])();
  bVar2 = glu::contextSupports(ctxType,(ApiType)0x23);
  if (!bVar2) {
    (anonymous_namespace)::getDataTypeExtension_abi_cxx11_
              (&local_170,(_anonymous_namespace_ *)0x2d,dataType);
    bVar2 = NegativeTestContext::isExtensionSupported(ctx,&local_170);
    std::__cxx11::string::~string((string *)&local_170);
    if (!bVar2) {
      return;
    }
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&shaderSource,"textureLod: Invalid P type.",(allocator<char> *)&local_190);
  NegativeTestContext::beginSection(ctx,&shaderSource);
  std::__cxx11::string::~string((string *)&shaderSource);
  lVar4 = 0;
LAB_0056cba6:
  if (lVar4 == 6) {
    NegativeTestContext::endSection(ctx);
    return;
  }
  shaderType = (&(anonymous_namespace)::s_shaders)[lVar4];
  bVar2 = NegativeTestContext::isShaderSupported(ctx,shaderType);
  if (bVar2) {
    __s = glu::getShaderTypeName(shaderType);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_190,__s,&local_1c9);
    std::operator+(&shaderSource,"Verify shader: ",&local_190);
    NegativeTestContext::beginSection(ctx,&shaderSource);
    std::__cxx11::string::~string((string *)&shaderSource);
    std::__cxx11::string::~string((string *)&local_190);
    local_1c8 = 0;
    lVar3 = 0;
    do {
      if (lVar3 != 3) {
        if (lVar3 == 4) goto LAB_0056cf14;
        DVar1 = *(DataType *)((long)&(anonymous_namespace)::s_floatTypes + local_1c8);
        (anonymous_namespace)::genShaderSourceTextureLod_abi_cxx11_
                  (&shaderSource,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,0x2d,DVar1,TYPE_FLOAT,
                   in_stack_fffffffffffffe28);
        std::__cxx11::string::string((string *)&local_50,(string *)&shaderSource);
        verifyShader(ctx,shaderType,&local_50);
        std::__cxx11::string::~string((string *)&local_50);
        std::__cxx11::string::~string((string *)&shaderSource);
        (anonymous_namespace)::genShaderSourceTextureLod_abi_cxx11_
                  (&shaderSource,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,0x3a,DVar1,TYPE_FLOAT,
                   in_stack_fffffffffffffe28);
        std::__cxx11::string::string((string *)&local_70,(string *)&shaderSource);
        verifyShader(ctx,shaderType,&local_70);
        std::__cxx11::string::~string((string *)&local_70);
        std::__cxx11::string::~string((string *)&shaderSource);
        (anonymous_namespace)::genShaderSourceTextureLod_abi_cxx11_
                  (&shaderSource,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,0x41,DVar1,TYPE_FLOAT,
                   in_stack_fffffffffffffe28);
        std::__cxx11::string::string((string *)&local_90,(string *)&shaderSource);
        verifyShader(ctx,shaderType,&local_90);
        std::__cxx11::string::~string((string *)&local_90);
        std::__cxx11::string::~string((string *)&shaderSource);
      }
      DVar1 = *(DataType *)((long)&(anonymous_namespace)::s_intTypes + local_1c8);
      (anonymous_namespace)::genShaderSourceTextureLod_abi_cxx11_
                (&shaderSource,(_anonymous_namespace_ *)ctx,(NegativeTestContext *)(ulong)shaderType
                 ,0x2d,DVar1,TYPE_FLOAT,in_stack_fffffffffffffe28);
      std::__cxx11::string::string((string *)&local_b0,(string *)&shaderSource);
      verifyShader(ctx,shaderType,&local_b0);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)&shaderSource);
      (anonymous_namespace)::genShaderSourceTextureLod_abi_cxx11_
                (&shaderSource,(_anonymous_namespace_ *)ctx,(NegativeTestContext *)(ulong)shaderType
                 ,0x3a,DVar1,TYPE_FLOAT,in_stack_fffffffffffffe28);
      std::__cxx11::string::string((string *)&local_d0,(string *)&shaderSource);
      verifyShader(ctx,shaderType,&local_d0);
      std::__cxx11::string::~string((string *)&local_d0);
      std::__cxx11::string::~string((string *)&shaderSource);
      (anonymous_namespace)::genShaderSourceTextureLod_abi_cxx11_
                (&shaderSource,(_anonymous_namespace_ *)ctx,(NegativeTestContext *)(ulong)shaderType
                 ,0x41,DVar1,TYPE_FLOAT,in_stack_fffffffffffffe28);
      std::__cxx11::string::string((string *)&local_f0,(string *)&shaderSource);
      verifyShader(ctx,shaderType,&local_f0);
      std::__cxx11::string::~string((string *)&local_f0);
      std::__cxx11::string::~string((string *)&shaderSource);
      DVar1 = *(DataType *)((long)&(anonymous_namespace)::s_uintTypes + local_1c8);
      (anonymous_namespace)::genShaderSourceTextureLod_abi_cxx11_
                (&shaderSource,(_anonymous_namespace_ *)ctx,(NegativeTestContext *)(ulong)shaderType
                 ,0x2d,DVar1,TYPE_FLOAT,in_stack_fffffffffffffe28);
      std::__cxx11::string::string((string *)&local_110,(string *)&shaderSource);
      verifyShader(ctx,shaderType,&local_110);
      std::__cxx11::string::~string((string *)&local_110);
      std::__cxx11::string::~string((string *)&shaderSource);
      (anonymous_namespace)::genShaderSourceTextureLod_abi_cxx11_
                (&shaderSource,(_anonymous_namespace_ *)ctx,(NegativeTestContext *)(ulong)shaderType
                 ,0x3a,DVar1,TYPE_FLOAT,in_stack_fffffffffffffe28);
      std::__cxx11::string::string((string *)&local_130,(string *)&shaderSource);
      verifyShader(ctx,shaderType,&local_130);
      std::__cxx11::string::~string((string *)&local_130);
      std::__cxx11::string::~string((string *)&shaderSource);
      (anonymous_namespace)::genShaderSourceTextureLod_abi_cxx11_
                (&shaderSource,(_anonymous_namespace_ *)ctx,(NegativeTestContext *)(ulong)shaderType
                 ,0x41,DVar1,TYPE_FLOAT,in_stack_fffffffffffffe28);
      std::__cxx11::string::string((string *)&local_150,(string *)&shaderSource);
      verifyShader(ctx,shaderType,&local_150);
      std::__cxx11::string::~string((string *)&local_150);
      std::__cxx11::string::~string((string *)&shaderSource);
      lVar3 = lVar3 + 1;
      local_1c8 = local_1c8 + 4;
    } while( true );
  }
  goto LAB_0056cf28;
LAB_0056cf14:
  NegativeTestContext::endSection(ctx);
LAB_0056cf28:
  lVar4 = lVar4 + 1;
  goto LAB_0056cba6;
}

Assistant:

void texture_lod_invalid_p (NegativeTestContext& ctx)
{
	DE_ASSERT(DE_LENGTH_OF_ARRAY(s_floatTypes) == DE_LENGTH_OF_ARRAY(s_intTypes));
	DE_ASSERT(DE_LENGTH_OF_ARRAY(s_floatTypes) == DE_LENGTH_OF_ARRAY(s_uintTypes));

	if (contextSupports(ctx.getRenderContext().getType(), glu::ApiType::es(3, 2)) || ctx.isExtensionSupported(getDataTypeExtension(glu::TYPE_SAMPLER_CUBE_ARRAY)))
	{
		ctx.beginSection("textureLod: Invalid P type.");
		for (int shaderNdx = 0; shaderNdx < DE_LENGTH_OF_ARRAY(s_shaders); ++shaderNdx)
		{
			if (ctx.isShaderSupported(s_shaders[shaderNdx]))
			{
				ctx.beginSection("Verify shader: " + std::string(getShaderTypeName(s_shaders[shaderNdx])));
				for (int dataTypeNdx = 0; dataTypeNdx < DE_LENGTH_OF_ARRAY(s_floatTypes); ++dataTypeNdx)
				{
					if (s_floatTypes[dataTypeNdx] != glu::TYPE_FLOAT_VEC4)
					{
						{
							const std::string shaderSource(genShaderSourceTextureLod(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_CUBE_ARRAY, s_floatTypes[dataTypeNdx], glu::TYPE_FLOAT));
							verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
						}
						{
							const std::string shaderSource(genShaderSourceTextureLod(ctx, s_shaders[shaderNdx], glu::TYPE_INT_SAMPLER_CUBE_ARRAY, s_floatTypes[dataTypeNdx], glu::TYPE_FLOAT));
							verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
						}
						{
							const std::string shaderSource(genShaderSourceTextureLod(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_CUBE_ARRAY, s_floatTypes[dataTypeNdx], glu::TYPE_FLOAT));
							verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
						}
					}
					{
						const std::string shaderSource(genShaderSourceTextureLod(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_CUBE_ARRAY, s_intTypes[dataTypeNdx], glu::TYPE_FLOAT));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTextureLod(ctx, s_shaders[shaderNdx], glu::TYPE_INT_SAMPLER_CUBE_ARRAY, s_intTypes[dataTypeNdx], glu::TYPE_FLOAT));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTextureLod(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_CUBE_ARRAY, s_intTypes[dataTypeNdx], glu::TYPE_FLOAT));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTextureLod(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_CUBE_ARRAY, s_uintTypes[dataTypeNdx], glu::TYPE_FLOAT));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTextureLod(ctx, s_shaders[shaderNdx], glu::TYPE_INT_SAMPLER_CUBE_ARRAY, s_uintTypes[dataTypeNdx], glu::TYPE_FLOAT));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTextureLod(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_CUBE_ARRAY, s_uintTypes[dataTypeNdx], glu::TYPE_FLOAT));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
				}
				ctx.endSection();
			}
		}
		ctx.endSection();
	}
}